

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonBondedInteractionsSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::NonBondedInteractionsSectionParser::parseLine
          (NonBondedInteractionsSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  double dVar1;
  double dVar2;
  ForceFieldOptions *pFVar3;
  int iVar4;
  int myMatt;
  iterator iVar5;
  EAMInteractionType *this_00;
  char *__format;
  uint uVar6;
  double dVar7;
  double dVar8;
  RealType RVar9;
  RealType RVar10;
  RealType RVar11;
  RealType RVar12;
  RealType RVar13;
  StringTokenizer tokenizer;
  string btype;
  string at1;
  string itype;
  string at2;
  StringTokenizer local_150;
  string local_f8;
  string local_d8;
  pair<int,_double> local_b8;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  ForceField *local_90;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_88;
  string local_70;
  string local_50;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_90 = ff;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_150,line,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  iVar4 = StringTokenizer::countTokens(&local_150);
  if (iVar4 < 3) {
    snprintf(painCave.errMsg,2000,
             "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  pFVar3 = this->options_;
  this->meus_ = (pFVar3->MetallicEnergyUnitScaling).data_;
  this->eus_ = (pFVar3->EnergyUnitScaling).data_;
  this->dus_ = (pFVar3->DistanceUnitScaling).data_;
  StringTokenizer::nextToken_abi_cxx11_(&local_d8,&local_150);
  StringTokenizer::nextToken_abi_cxx11_(&local_50,&local_150);
  StringTokenizer::nextToken_abi_cxx11_(&local_70,&local_150);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::NonBondedInteractionsSectionParser::NonBondedInteractionTypeEnum>_>_>
          ::find(&(this->stringToEnumMap_)._M_t,&local_70);
  __format = "NonBondedInteractionsSectionParser Error: Unknown Interaction Type at line %d\n";
  if (((_Rb_tree_header *)iVar5._M_node ==
       &(this->stringToEnumMap_)._M_t._M_impl.super__Rb_tree_header) ||
     (10 < iVar5._M_node[2]._M_color)) {
switchD_001b6124_caseD_7:
    snprintf(painCave.errMsg,2000,__format,(ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    uVar6 = iVar4 - 3;
    switch(iVar5._M_node[2]._M_color) {
    case _S_red:
      if (uVar6 != 3) {
LAB_001b65cc:
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 6 tokens expected.  \n"
        ;
        goto switchD_001b6124_caseD_7;
      }
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->eus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar2 = this->dus_;
      this_00 = (EAMInteractionType *)operator_new(0x80);
      MorseInteractionType::MorseInteractionType
                ((MorseInteractionType *)this_00,dVar7 * RVar10,RVar11 / dVar2,dVar8 * RVar9,
                 mtShifted);
      break;
    case _S_black:
      if (uVar6 != 2) {
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 5 tokens expected.  \n"
        ;
        goto switchD_001b6124_caseD_7;
      }
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->eus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      this_00 = (EAMInteractionType *)operator_new(0x70);
      LennardJonesInteractionType::LennardJonesInteractionType
                ((LennardJonesInteractionType *)this_00,dVar8 * RVar9,dVar7 * RVar10);
      break;
    case 2:
      if (uVar6 != 3) goto LAB_001b65cc;
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->eus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar2 = this->dus_;
      this_00 = (EAMInteractionType *)operator_new(0x80);
      MorseInteractionType::MorseInteractionType
                ((MorseInteractionType *)this_00,dVar7 * RVar10,RVar11 / dVar2,dVar8 * RVar9,
                 mtRepulsive);
      break;
    case 3:
      if (iVar4 < 6) goto LAB_001b65cc;
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->eus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      iVar4 = StringTokenizer::nextTokenAsInt(&local_150);
      this_00 = (EAMInteractionType *)operator_new(0x78);
      RepulsivePowerInteractionType::RepulsivePowerInteractionType
                ((RepulsivePowerInteractionType *)this_00,dVar8 * RVar9,dVar7 * RVar10,iVar4);
      break;
    case 4:
      if (uVar6 != 4) {
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 7 tokens expected.  \n"
        ;
        goto switchD_001b6124_caseD_7;
      }
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->eus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      iVar4 = StringTokenizer::nextTokenAsInt(&local_150);
      myMatt = StringTokenizer::nextTokenAsInt(&local_150);
      this_00 = (EAMInteractionType *)operator_new(0x78);
      MieInteractionType::MieInteractionType
                ((MieInteractionType *)this_00,dVar8 * RVar9,dVar7 * RVar10,iVar4,myMatt);
      break;
    case 5:
      if (uVar6 != 5) {
LAB_001b685c:
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 8 tokens expected.  \n"
        ;
        goto switchD_001b6124_caseD_7;
      }
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->eus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar2 = this->dus_;
      RVar12 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar13 = StringTokenizer::nextTokenAsDouble(&local_150);
      this_00 = (EAMInteractionType *)operator_new(0x88);
      MAWInteractionType::MAWInteractionType
                ((MAWInteractionType *)this_00,dVar7 * RVar10,RVar11 / dVar2,dVar8 * RVar9,RVar12,
                 RVar13);
      break;
    case 6:
      if (iVar4 < 7) {
LAB_001b679d:
        __format = "NonBondedInteractionsSectionParser Error: Not enough tokens at line %d\n";
        goto switchD_001b6124_caseD_7;
      }
      StringTokenizer::nextToken_abi_cxx11_(&local_f8,&local_150);
      std::locale::locale((locale *)&local_b8);
      toUpper<std::__cxx11::string>(&local_f8,(locale *)&local_b8);
      std::locale::~locale((locale *)&local_b8);
      dVar8 = this->eus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = RVar10 / this->dus_;
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar8 = dVar8 * RVar9;
      iVar4 = std::__cxx11::string::compare((char *)&local_f8);
      if (iVar4 == 0) {
        iVar4 = std::__cxx11::string::compare((char *)&local_f8);
        if (iVar4 == 0) {
          this_00 = (EAMInteractionType *)0x0;
          snprintf(painCave.errMsg,2000,
                   "NonBondedInteractionsSectionParser Error: Unknown Buckingham Type at line %d\n",
                   (ulong)(uint)lineNo);
          painCave.isFatal = 1;
          simError();
        }
        else {
          this_00 = (EAMInteractionType *)operator_new(0x90);
          BuckinghamInteractionType::BuckinghamInteractionType
                    ((BuckinghamInteractionType *)this_00,dVar8,dVar7,RVar10,btTraditional);
        }
      }
      else {
        dVar2 = this->dus_;
        RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
        dVar1 = this->eus_;
        RVar11 = StringTokenizer::nextTokenAsDouble(&local_150);
        this_00 = (EAMInteractionType *)operator_new(0x90);
        BuckinghamInteractionType::BuckinghamInteractionType
                  ((BuckinghamInteractionType *)this_00,dVar8,dVar7,RVar10,dVar2 * RVar9,
                   dVar1 * RVar11,btModified);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,
                        (ulong)(local_f8.field_2._M_allocated_capacity + 1));
      }
      if (this_00 == (EAMInteractionType *)0x0) goto LAB_001b69e0;
      break;
    case 7:
      goto switchD_001b6124_caseD_7;
    case 8:
      if (uVar6 != 7) {
        __format = 
        "NonBondedInteractionsSectionParser Error: Token number mismatch at line %d. 10 tokens expected.  \n"
        ;
        goto switchD_001b6124_caseD_7;
      }
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->meus_;
      RVar12 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar2 = this->meus_;
      local_98 = StringTokenizer::nextTokenAsDouble(&local_150);
      local_a0 = StringTokenizer::nextTokenAsDouble(&local_150);
      local_a8 = StringTokenizer::nextTokenAsDouble(&local_150);
      this_00 = (EAMInteractionType *)operator_new(0xe0);
      EAMInteractionType::EAMInteractionType
                (this_00,dVar8 * RVar9,RVar10,RVar11,dVar7 * RVar12,dVar2 * local_98,local_a0,
                 local_a8);
      break;
    case 9:
      if (uVar6 != 5) goto LAB_001b685c;
      dVar8 = this->dus_;
      RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar10 = StringTokenizer::nextTokenAsDouble(&local_150);
      dVar7 = this->meus_;
      RVar11 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar12 = StringTokenizer::nextTokenAsDouble(&local_150);
      RVar13 = StringTokenizer::nextTokenAsDouble(&local_150);
      this_00 = (EAMInteractionType *)operator_new(0xe0);
      EAMInteractionType::EAMInteractionType
                (this_00,dVar8 * RVar9,RVar10,dVar7 * RVar11,RVar12,RVar13);
      break;
    case 10:
      if ((uVar6 & 1) != 0 || iVar4 < 5) goto LAB_001b679d;
      local_f8._M_dataplus._M_p = (pointer)0x0;
      local_f8._M_string_length = 0;
      local_f8.field_2._M_allocated_capacity = 0;
      uVar6 = uVar6 >> 1;
      do {
        iVar4 = StringTokenizer::nextTokenAsInt(&local_150);
        RVar9 = StringTokenizer::nextTokenAsDouble(&local_150);
        dVar8 = this->eus_;
        local_b8.second = pow(this->dus_,(double)iVar4);
        local_b8.second = local_b8.second * RVar9 * dVar8;
        local_b8.first = iVar4;
        if (local_f8._M_string_length == local_f8.field_2._M_allocated_capacity) {
          std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
          _M_realloc_insert<std::pair<int,double>>
                    ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                     &local_f8,(iterator)local_f8._M_string_length,&local_b8);
        }
        else {
          *(ulong *)local_f8._M_string_length = CONCAT44(local_b8._4_4_,iVar4);
          *(double *)(local_f8._M_string_length + 8) = local_b8.second;
          local_f8._M_string_length = local_f8._M_string_length + 0x10;
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
      this_00 = (EAMInteractionType *)operator_new(0x90);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
                (&local_88,
                 (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                 &local_f8);
      InversePowerSeriesInteractionType::InversePowerSeriesInteractionType
                ((InversePowerSeriesInteractionType *)this_00,&local_88);
      if (local_88.
          super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.
                        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_f8._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_f8._M_dataplus._M_p,
                        local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
      }
    }
    ForceField::addNonBondedInteractionType
              (local_90,&local_d8,&local_50,&this_00->super_NonBondedInteractionType);
  }
LAB_001b69e0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.delim_._M_dataplus._M_p != &local_150.delim_.field_2) {
    operator_delete(local_150.delim_._M_dataplus._M_p,
                    local_150.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.tokenString_._M_dataplus._M_p != &local_150.tokenString_.field_2) {
    operator_delete(local_150.tokenString_._M_dataplus._M_p,
                    local_150.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NonBondedInteractionsSectionParser::parseLine(ForceField& ff,
                                                     const std::string& line,
                                                     int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();
    if (nTokens < 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NonBondedInteractionsSectionParser Error: Not enough tokens at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    }

    meus_ = options_.getMetallicEnergyUnitScaling();
    eus_  = options_.getEnergyUnitScaling();
    dus_  = options_.getDistanceUnitScaling();

    std::string at1   = tokenizer.nextToken();
    std::string at2   = tokenizer.nextToken();
    std::string itype = tokenizer.nextToken();

    NonBondedInteractionTypeEnum nbit = getNonBondedInteractionTypeEnum(itype);
    nTokens -= 3;
    NonBondedInteractionType* interactionType = NULL;

    // switch is a nightmare to maintain
    switch (nbit) {
    case MAW:
      if (nTokens != 5) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 8 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r_e    = dus_ * tokenizer.nextTokenAsDouble();
        RealType D_e    = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta   = tokenizer.nextTokenAsDouble() / dus_;
        RealType ca1    = tokenizer.nextTokenAsDouble();
        RealType cb1    = tokenizer.nextTokenAsDouble();
        interactionType = new MAWInteractionType(D_e, beta, r_e, ca1, cb1);
      }
      break;

    case ShiftedMorse:
      if (nTokens != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r0     = dus_ * tokenizer.nextTokenAsDouble();
        RealType D0     = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta0  = tokenizer.nextTokenAsDouble() / dus_;
        interactionType = new MorseInteractionType(D0, beta0, r0, mtShifted);
      }
      break;

    case RepulsiveMorse:
      if (nTokens != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType r0     = dus_ * tokenizer.nextTokenAsDouble();
        RealType D0     = eus_ * tokenizer.nextTokenAsDouble();
        RealType beta0  = tokenizer.nextTokenAsDouble() / dus_;
        interactionType = new MorseInteractionType(D0, beta0, r0, mtRepulsive);
      }
      break;

    case LennardJones:
      if (nTokens != 2) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 5 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        interactionType  = new LennardJonesInteractionType(sigma, epsilon);
      }
      break;

    case RepulsivePower:
      if (nTokens < 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 6 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        interactionType =
            new RepulsivePowerInteractionType(sigma, epsilon, nRep);
      }
      break;

    case Mie:
      if (nTokens != 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 7 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType sigma   = dus_ * tokenizer.nextTokenAsDouble();
        RealType epsilon = eus_ * tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();
        interactionType  = new MieInteractionType(sigma, epsilon, nRep, mAtt);
      }
      break;

    case Buckingham:
      if (nTokens < 4) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Not enough tokens "
                 "at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        std::string btype = tokenizer.nextToken();
        toUpper(btype);

        RealType A = eus_ * tokenizer.nextTokenAsDouble();
        RealType B = tokenizer.nextTokenAsDouble() / dus_;
        RealType C =
            tokenizer.nextTokenAsDouble();  // should also have a scaling
        RealType sigma   = 0.0;
        RealType epsilon = 0.0;

        if (btype.compare("MODIFIED")) {
          sigma           = dus_ * tokenizer.nextTokenAsDouble();
          epsilon         = eus_ * tokenizer.nextTokenAsDouble();
          interactionType = new BuckinghamInteractionType(A, B, C, sigma,
                                                          epsilon, btModified);

        } else if (btype.compare("TRADITIONAL")) {
          interactionType =
              new BuckinghamInteractionType(A, B, C, btTraditional);
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "NonBondedInteractionsSectionParser Error: Unknown "
                   "Buckingham Type at "
                   "line %d\n",
                   lineNo);
          painCave.isFatal = 1;
          simError();
        }
      }
      break;

    case EAMZhou:
      if (nTokens != 7) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 10 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType re    = dus_ * tokenizer.nextTokenAsDouble();
        RealType alpha = tokenizer.nextTokenAsDouble();
        RealType beta  = tokenizer.nextTokenAsDouble();
        // Because EAM is a metallic potential, we'll use the metallic
        // unit scaling for these two parameters
        RealType A      = meus_ * tokenizer.nextTokenAsDouble();
        RealType B      = meus_ * tokenizer.nextTokenAsDouble();
        RealType kappa  = tokenizer.nextTokenAsDouble();
        RealType lambda = tokenizer.nextTokenAsDouble();

        interactionType =
            new EAMInteractionType(re, alpha, beta, A, B, kappa, lambda);
      }
      break;

    case EAMOxides:
      if (nTokens != 5) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Token number "
                 "mismatch at line "
                 "%d. 8 tokens expected.  \n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        RealType re    = dus_ * tokenizer.nextTokenAsDouble();
        RealType alpha = tokenizer.nextTokenAsDouble();
        // Because EAM is a metallic potential, we'll use the metallic
        // unit scaling for these two parameters
        RealType A  = meus_ * tokenizer.nextTokenAsDouble();
        RealType Ci = tokenizer.nextTokenAsDouble();
        RealType Cj = tokenizer.nextTokenAsDouble();

        interactionType = new EAMInteractionType(re, alpha, A, Ci, Cj);
      }
      break;

    case InversePowerSeries:
      if (nTokens < 2 || nTokens % 2 != 0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "NonBondedInteractionsSectionParser Error: Not enough tokens "
                 "at line %d\n",
                 lineNo);
        painCave.isFatal = 1;
        simError();
      } else {
        std::vector<std::pair<int, RealType>> series;
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble() * eus_ * pow(dus_, power);
          series.push_back(std::make_pair(power, coefficient));
        }
        interactionType = new InversePowerSeriesInteractionType(series);
      }
      break;

    case Unknown:
    default:
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "NonBondedInteractionsSectionParser Error: Unknown Interaction "
               "Type at "
               "line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();

      break;
    }

    if (interactionType != NULL) {
      ff.addNonBondedInteractionType(at1, at2, interactionType);
    }
  }